

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextRemoveNode
               (ImGuiContext *ctx,ImGuiDockNode *node,bool merge_sibling_into_parent_node)

{
  ImGuiDockContext *this;
  ImGuiDockNode *parent_node;
  bool bVar1;
  bool bVar2;
  long lVar3;
  ImGuiDockNode *merge_lead_child;
  
  this = ctx->DockContext;
  if (node->HostWindow != (ImGuiWindow *)0x0) {
    node->HostWindow->DockNodeAsHost = (ImGuiDockNode *)0x0;
  }
  parent_node = node->ParentNode;
  if (merge_sibling_into_parent_node && parent_node != (ImGuiDockNode *)0x0) {
    merge_lead_child = parent_node->ChildNodes[0];
    if (merge_lead_child == node) {
      merge_lead_child = parent_node->ChildNodes[1];
    }
    DockNodeTreeMerge(ctx,parent_node,merge_lead_child);
    return;
  }
  if (parent_node != (ImGuiDockNode *)0x0) {
    lVar3 = 0;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      if (parent_node->ChildNodes[lVar3] == node) {
        node->ParentNode->ChildNodes[lVar3] = (ImGuiDockNode *)0x0;
      }
      lVar3 = 1;
      bVar1 = false;
    } while (bVar2);
  }
  ImGuiStorage::SetVoidPtr(&this->Nodes,node->ID,(void *)0x0);
  IM_DELETE<ImGuiDockNode>(node);
  return;
}

Assistant:

static void ImGui::DockContextRemoveNode(ImGuiContext* ctx, ImGuiDockNode* node, bool merge_sibling_into_parent_node)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = ctx->DockContext;

    IMGUI_DEBUG_LOG_DOCKING("DockContextRemoveNode 0x%08X\n", node->ID);
    IM_ASSERT(DockContextFindNodeByID(ctx, node->ID) == node);
    IM_ASSERT(node->ChildNodes[0] == NULL && node->ChildNodes[1] == NULL);
    IM_ASSERT(node->Windows.Size == 0);

    if (node->HostWindow)
        node->HostWindow->DockNodeAsHost = NULL;

    ImGuiDockNode* parent_node = node->ParentNode;
    const bool merge = (merge_sibling_into_parent_node && parent_node != NULL);
    if (merge)
    {
        IM_ASSERT(parent_node->ChildNodes[0] == node || parent_node->ChildNodes[1] == node);
        ImGuiDockNode* sibling_node = (parent_node->ChildNodes[0] == node ? parent_node->ChildNodes[1] : parent_node->ChildNodes[0]);
        DockNodeTreeMerge(&g, parent_node, sibling_node);
    }
    else
    {
        for (int n = 0; parent_node && n < IM_ARRAYSIZE(parent_node->ChildNodes); n++)
            if (parent_node->ChildNodes[n] == node)
                node->ParentNode->ChildNodes[n] = NULL;
        dc->Nodes.SetVoidPtr(node->ID, NULL);
        IM_DELETE(node);
    }
}